

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O1

string * __thiscall
StatusPrinter::FormatProgressStatus_abi_cxx11_
          (string *__return_storage_ptr__,StatusPrinter *this,char *progress_status_format,
          int64_t time_millis)

{
  char cVar1;
  double dVar2;
  ulong uVar3;
  char *__format;
  char cVar4;
  undefined4 uVar5;
  string out;
  char buf [32];
  _Alloc_hider local_80;
  size_type local_78;
  char local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  string *local_60;
  char local_58 [40];
  
  local_80._M_p = &local_70;
  local_78 = 0;
  local_70 = '\0';
  local_60 = __return_storage_ptr__;
  do {
    cVar4 = (char)&local_80;
    if (*progress_status_format != '%') {
      if (*progress_status_format == '\0') {
        (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
        if (local_80._M_p == &local_70) {
          (local_60->field_2)._M_allocated_capacity = CONCAT71(uStack_6f,local_70);
          *(undefined8 *)((long)&local_60->field_2 + 8) = uStack_68;
        }
        else {
          (local_60->_M_dataplus)._M_p = local_80._M_p;
          (local_60->field_2)._M_allocated_capacity = CONCAT71(uStack_6f,local_70);
        }
        local_60->_M_string_length = local_78;
        return local_60;
      }
      std::__cxx11::string::push_back(cVar4);
      goto LAB_001a7f92;
    }
    cVar1 = progress_status_format[1];
    progress_status_format = progress_status_format + 1;
    switch(cVar1) {
    case 'c':
      SlidingRateInfo::UpdateRate(&this->current_rate_,this->finished_edges_,this->time_millis_);
      dVar2 = (this->current_rate_).rate_;
      goto LAB_001a7eea;
    case 'd':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
    case 'q':
switchD_001a7e7e_caseD_64:
      Fatal("unknown placeholder \'%%%c\' in $NINJA_STATUS",(ulong)(uint)(int)cVar1);
    case 'e':
      uVar5 = SUB84((double)this->time_millis_ / 1000.0,0);
      __format = "%.3f";
      goto LAB_001a7f80;
    case 'f':
      uVar3 = (ulong)(uint)this->finished_edges_;
      break;
    case 'o':
      dVar2 = (double)this->finished_edges_ / ((double)this->time_millis_ / 1000.0);
LAB_001a7eea:
      uVar5 = SUB84(dVar2,0);
      if ((dVar2 != -1.0) || (NAN(dVar2))) {
        __format = "%.1f";
LAB_001a7f80:
        snprintf(local_58,0x20,__format,uVar5);
      }
      else {
        local_58[0] = '?';
        local_58[1] = '\0';
      }
      goto LAB_001a7f87;
    case 'p':
      snprintf(local_58,0x20,"%3i%%",
               (long)(this->finished_edges_ * 100) / (long)this->total_edges_ & 0xffffffff);
      std::__cxx11::string::append((char *)&local_80);
      goto LAB_001a7f92;
    case 'r':
      uVar3 = (ulong)(uint)this->running_edges_;
      break;
    case 's':
      uVar3 = (ulong)(uint)this->started_edges_;
      break;
    case 't':
      uVar3 = (ulong)(uint)this->total_edges_;
      break;
    case 'u':
      uVar3 = (ulong)(uint)(this->total_edges_ - this->started_edges_);
      break;
    default:
      if (cVar1 != '%') goto switchD_001a7e7e_caseD_64;
      std::__cxx11::string::push_back(cVar4);
      goto LAB_001a7f92;
    }
    snprintf(local_58,0x20,"%d",uVar3);
LAB_001a7f87:
    std::__cxx11::string::append((char *)&local_80);
LAB_001a7f92:
    progress_status_format = progress_status_format + 1;
  } while( true );
}

Assistant:

string StatusPrinter::FormatProgressStatus(const char* progress_status_format,
                                           int64_t time_millis) const {
  string out;
  char buf[32];
  for (const char* s = progress_status_format; *s != '\0'; ++s) {
    if (*s == '%') {
      ++s;
      switch (*s) {
      case '%':
        out.push_back('%');
        break;

        // Started edges.
      case 's':
        snprintf(buf, sizeof(buf), "%d", started_edges_);
        out += buf;
        break;

        // Total edges.
      case 't':
        snprintf(buf, sizeof(buf), "%d", total_edges_);
        out += buf;
        break;

        // Running edges.
      case 'r': {
        snprintf(buf, sizeof(buf), "%d", running_edges_);
        out += buf;
        break;
      }

        // Unstarted edges.
      case 'u':
        snprintf(buf, sizeof(buf), "%d", total_edges_ - started_edges_);
        out += buf;
        break;

        // Finished edges.
      case 'f':
        snprintf(buf, sizeof(buf), "%d", finished_edges_);
        out += buf;
        break;

        // Overall finished edges per second.
      case 'o':
        SnprintfRate(finished_edges_ / (time_millis_ / 1e3), buf, "%.1f");
        out += buf;
        break;

        // Current rate, average over the last '-j' jobs.
      case 'c':
        current_rate_.UpdateRate(finished_edges_, time_millis_);
        SnprintfRate(current_rate_.rate(), buf, "%.1f");
        out += buf;
        break;

        // Percentage
      case 'p': {
        int percent = (100 * finished_edges_) / total_edges_;
        snprintf(buf, sizeof(buf), "%3i%%", percent);
        out += buf;
        break;
      }

      case 'e': {
        snprintf(buf, sizeof(buf), "%.3f", time_millis_ / 1e3);
        out += buf;
        break;
      }

      default:
        Fatal("unknown placeholder '%%%c' in $NINJA_STATUS", *s);
        return "";
      }
    } else {
      out.push_back(*s);
    }
  }

  return out;
}